

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O0

void __thiscall IDisk::CreateSingleTrackFromMultiRevolutions(IDisk *this,int side,int track)

{
  Revolution *pRVar1;
  long lVar2;
  uint uVar3;
  Revolution *pRVar4;
  uchar *puVar5;
  uint local_4c;
  uint local_48;
  uint rev_1;
  uint rev;
  undefined1 local_38 [8];
  Track track_buffer;
  int track_local;
  int side_local;
  IDisk *this_local;
  
  track_buffer.full_size_ = track;
  track_buffer.gap3_size_ = side;
  if (this->side_[side].tracks[track].nb_revolutions == 1) {
    this->side_[side].tracks[track].bitfield =
         (this->side_[side].tracks[track].revolution)->bitfield;
    this->side_[side].tracks[track].size = (this->side_[side].tracks[track].revolution)->size;
    pRVar1 = this->side_[side].tracks[track].revolution;
    if (pRVar1 != (Revolution *)0x0) {
      lVar2 = *(long *)&pRVar1[-1].track_info.full_size_;
      pRVar4 = pRVar1 + lVar2;
      while (pRVar1 != pRVar4) {
        pRVar4 = pRVar4 + -1;
        anon_struct_48_3_f145af35::~Revolution((anon_struct_48_3_f145af35 *)pRVar4);
      }
      operator_delete__(&pRVar1[-1].track_info.full_size_,lVar2 * 0x30 + 8);
    }
    this->side_[track_buffer.gap3_size_].tracks[track_buffer.full_size_].nb_revolutions = 0;
    this->side_[track_buffer.gap3_size_].tracks[track_buffer.full_size_].revolution =
         (Revolution *)0x0;
  }
  else {
    Track::Track((Track *)local_38);
    uVar3 = (*this->_vptr_IDisk[0x15])
                      (this,(ulong)(uint)track_buffer.gap3_size_,
                       (ulong)(uint)track_buffer.full_size_);
    if ((uVar3 & 1) == 0) {
      for (local_48 = 0;
          local_48 <
          this->side_[track_buffer.gap3_size_].tracks[track_buffer.full_size_].nb_revolutions;
          local_48 = local_48 + 1) {
        puVar5 = this->side_[track_buffer.gap3_size_].tracks[track_buffer.full_size_].revolution
                 [local_48].bitfield;
        if (puVar5 != (uchar *)0x0) {
          operator_delete__(puVar5);
        }
      }
      pRVar1 = this->side_[track_buffer.gap3_size_].tracks[track_buffer.full_size_].revolution;
      if (pRVar1 != (Revolution *)0x0) {
        lVar2 = *(long *)&pRVar1[-1].track_info.full_size_;
        pRVar4 = pRVar1 + lVar2;
        while (pRVar1 != pRVar4) {
          pRVar4 = pRVar4 + -1;
          anon_struct_48_3_f145af35::~Revolution((anon_struct_48_3_f145af35 *)pRVar4);
        }
        operator_delete__(&pRVar1[-1].track_info.full_size_,lVar2 * 0x30 + 8);
      }
      this->side_[track_buffer.gap3_size_].tracks[track_buffer.full_size_].revolution =
           (Revolution *)0x0;
      this->side_[track_buffer.gap3_size_].tracks[track_buffer.full_size_].nb_revolutions = 0;
      this->side_[track_buffer.gap3_size_].tracks[track_buffer.full_size_].bitfield = (uchar *)0x0;
      this->side_[track_buffer.gap3_size_].tracks[track_buffer.full_size_].size = 0;
    }
    else {
      for (local_4c = 0;
          local_4c <
          this->side_[track_buffer.gap3_size_].tracks[track_buffer.full_size_].nb_revolutions;
          local_4c = local_4c + 1) {
        puVar5 = this->side_[track_buffer.gap3_size_].tracks[track_buffer.full_size_].revolution
                 [local_4c].bitfield;
        if (puVar5 != (uchar *)0x0) {
          operator_delete__(puVar5);
        }
      }
      pRVar1 = this->side_[track_buffer.gap3_size_].tracks[track_buffer.full_size_].revolution;
      if (pRVar1 != (Revolution *)0x0) {
        lVar2 = *(long *)&pRVar1[-1].track_info.full_size_;
        pRVar4 = pRVar1 + lVar2;
        while (pRVar1 != pRVar4) {
          pRVar4 = pRVar4 + -1;
          anon_struct_48_3_f145af35::~Revolution((anon_struct_48_3_f145af35 *)pRVar4);
        }
        operator_delete__(&pRVar1[-1].track_info.full_size_,lVar2 * 0x30 + 8);
      }
      this->side_[track_buffer.gap3_size_].tracks[track_buffer.full_size_].nb_revolutions = 0;
      this->side_[track_buffer.gap3_size_].tracks[track_buffer.full_size_].revolution =
           (Revolution *)0x0;
    }
    Track::~Track((Track *)local_38);
  }
  if (this->side_[track_buffer.gap3_size_].tracks[track_buffer.full_size_].bitfield == (uchar *)0x0)
  {
    this->side_[track_buffer.gap3_size_].tracks[track_buffer.full_size_].size = 0x40000;
    puVar5 = (uchar *)operator_new__(0x40000);
    this->side_[track_buffer.gap3_size_].tracks[track_buffer.full_size_].bitfield = puVar5;
    memset(this->side_[track_buffer.gap3_size_].tracks[track_buffer.full_size_].bitfield,4,0x40000);
  }
  return;
}

Assistant:

void IDisk::CreateSingleTrackFromMultiRevolutions(int side, int track)
{
   // Only one revolution : Nothing else to add...
   if (side_[side].tracks[track].nb_revolutions == 1)
   {
      side_[side].tracks[track].bitfield = side_[side].tracks[track].revolution[0].bitfield;
      side_[side].tracks[track].size = side_[side].tracks[track].revolution[0].size;

      delete[]side_[side].tracks[track].revolution;
      side_[side].tracks[track].nb_revolutions = 0;
      side_[side].tracks[track].revolution = nullptr;
   }
   else
   {
      // Otherwise
      Track track_buffer;

      if (!CreateTrackFromRevolution(side, track))
      {
         for (unsigned int rev = 0; rev < side_[side].tracks[track].nb_revolutions; rev++)
         {
            delete[]side_[side].tracks[track].revolution[rev].bitfield;
         }
         delete[]side_[side].tracks[track].revolution;
         side_[side].tracks[track].revolution = nullptr;
         side_[side].tracks[track].nb_revolutions = 0;
         side_[side].tracks[track].bitfield = nullptr;
         side_[side].tracks[track].size = 0;
      }
      else
      {
         for (unsigned int rev = 0; rev < side_[side].tracks[track].nb_revolutions; rev++)
         {
            delete[]side_[side].tracks[track].revolution[rev].bitfield;
         }
         delete[]side_[side].tracks[track].revolution;
         side_[side].tracks[track].nb_revolutions = 0;
         side_[side].tracks[track].revolution = nullptr;
      }
   }
   // Now, just clear the Revolution structure.
   if (side_[side].tracks[track].bitfield == nullptr)
   {
      // Set a default (unformatted) track
      side_[side].tracks[track].size = DEFAULT_TRACK_SIZE * 16;
      side_[side].tracks[track].bitfield = new unsigned char[DEFAULT_TRACK_SIZE * 16];
      memset(side_[side].tracks[track].bitfield, BIT_WEAK, DEFAULT_TRACK_SIZE * 16);
   }
}